

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_point_2d(mg_session *session,mg_point_2d **point_2d)

{
  int iVar1;
  mg_point_2d *val;
  
  iVar1 = mg_session_check_struct_header(session,0xb3,'X');
  if (iVar1 == 0) {
    val = mg_point_2d_alloc(session->decoder_allocator);
    if (val == (mg_point_2d *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(session,&val->srid);
      if (((iVar1 == 0) && (iVar1 = mg_session_read_float(session,&val->x), iVar1 == 0)) &&
         (iVar1 = mg_session_read_float(session,&val->y), iVar1 == 0)) {
        *point_2d = val;
        return 0;
      }
      mg_allocator_free(session->decoder_allocator,val);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_point_2d(mg_session *session, mg_point_2d **point_2d) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 3), MG_SIGNATURE_POINT_2D));
  mg_point_2d *point_2d_tmp = mg_point_2d_alloc(session->decoder_allocator);
  if (!point_2d_tmp) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;
  status = mg_session_read_integer(session, &point_2d_tmp->srid);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_float(session, &point_2d_tmp->x);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_float(session, &point_2d_tmp->y);
  if (status != 0) {
    goto cleanup;
  }

  *point_2d = point_2d_tmp;
  return 0;

cleanup:
  mg_allocator_free(session->decoder_allocator, point_2d_tmp);
  return status;
}